

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O3

void __thiscall
duckdb::Connection::
CreateScalarFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
          (Connection *this,string *name,_func_string_t_string_t_string_t_string_t *udf_func)

{
  type context;
  scalar_function_t function;
  _Any_data _Stack_68;
  _Manager_type local_58;
  LogicalType local_48 [24];
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/function/udf_function.hpp:166:36)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/function/udf_function.hpp:166:36)>
             ::_M_manager;
  local_30._M_unused._0_8_ = (undefined8)udf_func;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_68,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_30);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(local_48,INVALID);
  UDFWrapper::RegisterFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
            (name,(scalar_function_t *)&_Stack_68,context,local_48);
  duckdb::LogicalType::~LogicalType(local_48);
  if (local_58 != (code *)0x0) {
    (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)((_Any_data *)&local_30,(_Any_data *)&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void CreateScalarFunction(const string &name, TR (*udf_func)(ARGS...)) {
		scalar_function_t function = UDFWrapper::CreateScalarFunction<TR, ARGS...>(name, udf_func);
		UDFWrapper::RegisterFunction<TR, ARGS...>(name, function, *context);
	}